

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPF.cpp
# Opt level: O1

void __thiscall
OpenMD::RNEMD::SPFMethod::doRNEMDImpl
          (SPFMethod *this,SelectionManager *smanA,SelectionManager *smanB)

{
  uint *puVar1;
  double *pdVar2;
  int iVar3;
  Molecule *this_00;
  SimInfo *pSVar4;
  Snapshot *pSVar5;
  double dVar6;
  StuntDouble *pSVar7;
  uint i;
  long lVar8;
  long lVar9;
  Vector<double,_3U> result_1;
  int selej;
  Vector<double,_3U> result_2;
  Vector<double,_3U> result;
  int selei;
  Vector3d vel;
  RealType b;
  RealType a;
  Vector3d v_b;
  Vector3d v_a;
  double local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_120;
  undefined8 local_118;
  int local_10c;
  double local_108;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_100;
  undefined8 local_f8;
  double local_e8 [4];
  double local_c8;
  int local_bc;
  double local_b8 [4];
  double local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_90;
  undefined8 local_88;
  RealType local_78;
  RealType local_70;
  Vector3d local_68;
  Vector3d local_48;
  
  if ((this->super_RNEMD).doRNEMD_ == true) {
    if (this->forceManager_->hasSelectedMolecule_ == false) {
      selectMolecule(this);
    }
    lVar9 = 0;
    if (this->spfTarget_ <= 0.0) {
      do {
        OpenMDBitSet::operator-=
                  ((OpenMDBitSet *)
                   ((long)&(((smanB->ss_).bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                           super__Bvector_base<std::allocator<bool>_> + lVar9),
                   (OpenMDBitSet *)
                   ((long)&(((this->selectedMoleculeMan_).ss_.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                           super__Bvector_base<std::allocator<bool>_> + lVar9));
        lVar9 = lVar9 + 0x28;
      } while (lVar9 != 0xf0);
    }
    else {
      do {
        OpenMDBitSet::operator-=
                  ((OpenMDBitSet *)
                   ((long)&(((smanA->ss_).bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                           super__Bvector_base<std::allocator<bool>_> + lVar9),
                   (OpenMDBitSet *)
                   ((long)&(((this->selectedMoleculeMan_).ss_.bitsets_.
                             super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                             ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                           super__Bvector_base<std::allocator<bool>_> + lVar9));
        lVar9 = lVar9 + 0x28;
      } while (lVar9 != 0xf0);
    }
    (this->smanA_).info_ = smanA->info_;
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator=
              (&(this->smanA_).ss_.bitsets_,&(smanA->ss_).bitsets_);
    std::vector<int,_std::allocator<int>_>::operator=(&(this->smanA_).nObjects_,&smanA->nObjects_);
    std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::operator=
              (&(this->smanA_).stuntdoubles_,&smanA->stuntdoubles_);
    std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::operator=
              (&(this->smanA_).bonds_,&smanA->bonds_);
    std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::operator=
              (&(this->smanA_).bends_,&smanA->bends_);
    std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::operator=
              (&(this->smanA_).torsions_,&smanA->torsions_);
    std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::operator=
              (&(this->smanA_).inversions_,&smanA->inversions_);
    std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::operator=
              (&(this->smanA_).molecules_,&smanA->molecules_);
    (this->smanB_).info_ = smanB->info_;
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator=
              (&(this->smanB_).ss_.bitsets_,&(smanB->ss_).bitsets_);
    std::vector<int,_std::allocator<int>_>::operator=(&(this->smanB_).nObjects_,&smanB->nObjects_);
    std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::operator=
              (&(this->smanB_).stuntdoubles_,&smanB->stuntdoubles_);
    std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>::operator=
              (&(this->smanB_).bonds_,&smanB->bonds_);
    std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>::operator=
              (&(this->smanB_).bends_,&smanB->bends_);
    std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>::operator=
              (&(this->smanB_).torsions_,&smanB->torsions_);
    std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>::operator=
              (&(this->smanB_).inversions_,&smanB->inversions_);
    std::vector<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>::operator=
              (&(this->smanB_).molecules_,&smanB->molecules_);
    if (this->failedLastTrial_ == false) {
      local_48.super_Vector<double,_3U>.data_[0] = 0.0;
      local_48.super_Vector<double,_3U>.data_[1] = 0.0;
      local_48.super_Vector<double,_3U>.data_[2] = 0.0;
      local_68.super_Vector<double,_3U>.data_[2] = 0.0;
      local_68.super_Vector<double,_3U>.data_[0] = 0.0;
      local_68.super_Vector<double,_3U>.data_[1] = 0.0;
      local_70 = 0.0;
      local_78 = 0.0;
      isValidExchange(this,&local_48,&local_68,&local_70,&local_78);
      local_88 = 0;
      local_98 = 0.0;
      p_Stack_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_bc = 0;
      local_10c = 0;
      pSVar7 = SelectionManager::beginSelected(smanA,&local_bc);
      if (pSVar7 != (StuntDouble *)0x0) {
        local_c8 = local_70;
        do {
          lVar9 = *(long *)((long)&(pSVar7->snapshotMan_->currentSnapshot_->atomData).velocity.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + pSVar7->storage_);
          local_b8[2] = (double)*(undefined8 *)(lVar9 + 0x10 + (long)pSVar7->localIndex_ * 0x18);
          pdVar2 = (double *)(lVar9 + (long)pSVar7->localIndex_ * 0x18);
          local_b8[0] = *pdVar2;
          local_b8[1] = pdVar2[1];
          local_e8[0] = 0.0;
          local_e8[1] = 0.0;
          local_e8[2] = 0.0;
          lVar9 = 0;
          do {
            local_e8[lVar9] = local_b8[lVar9] - local_48.super_Vector<double,_3U>.data_[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          local_128 = 0.0;
          p_Stack_120 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_118 = 0;
          lVar9 = 0;
          do {
            (&local_128)[lVar9] = local_e8[lVar9] * local_c8;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          local_108 = 0.0;
          p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_f8 = 0;
          lVar9 = 0;
          do {
            (&local_108)[lVar9] =
                 (&local_128)[lVar9] + local_48.super_Vector<double,_3U>.data_[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          local_88 = local_f8;
          local_98 = local_108;
          p_Stack_90 = p_Stack_100;
          pSVar5 = pSVar7->snapshotMan_->currentSnapshot_;
          lVar8 = (long)pSVar7->localIndex_;
          lVar9 = *(long *)((long)&(pSVar5->atomData).velocity.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + pSVar7->storage_);
          *(undefined8 *)(lVar9 + 0x10 + lVar8 * 0x18) = local_f8;
          pdVar2 = (double *)(lVar9 + lVar8 * 0x18);
          *pdVar2 = local_108;
          pdVar2[1] = (double)p_Stack_100;
          if (pSVar7->objType_ - otDAtom < 2) {
            lVar9 = *(long *)((long)&(pSVar5->atomData).angularMomentum.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + pSVar7->storage_);
            local_e8[2] = (double)*(undefined8 *)(lVar9 + 0x10 + lVar8 * 0x18);
            pdVar2 = (double *)(lVar9 + lVar8 * 0x18);
            local_e8[0] = *pdVar2;
            local_e8[1] = pdVar2[1];
            local_128 = 0.0;
            p_Stack_120 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_118 = 0;
            lVar9 = 0;
            do {
              (&local_128)[lVar9] = local_e8[lVar9] * local_c8;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            local_f8 = local_118;
            local_108 = local_128;
            p_Stack_100 = p_Stack_120;
            iVar3 = pSVar7->localIndex_;
            lVar9 = *(long *)((long)&(pSVar7->snapshotMan_->currentSnapshot_->atomData).
                                     angularMomentum.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + pSVar7->storage_);
            *(undefined8 *)(lVar9 + 0x10 + (long)iVar3 * 0x18) = local_118;
            pdVar2 = (double *)(lVar9 + (long)iVar3 * 0x18);
            *pdVar2 = local_128;
            pdVar2[1] = (double)p_Stack_120;
          }
          pSVar7 = SelectionManager::nextSelected(smanA,&local_bc);
        } while (pSVar7 != (StuntDouble *)0x0);
      }
      pSVar7 = SelectionManager::beginSelected(smanB,&local_10c);
      if (pSVar7 != (StuntDouble *)0x0) {
        local_c8 = local_78;
        do {
          lVar9 = *(long *)((long)&(pSVar7->snapshotMan_->currentSnapshot_->atomData).velocity.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + pSVar7->storage_);
          local_b8[2] = (double)*(undefined8 *)(lVar9 + 0x10 + (long)pSVar7->localIndex_ * 0x18);
          pdVar2 = (double *)(lVar9 + (long)pSVar7->localIndex_ * 0x18);
          local_b8[0] = *pdVar2;
          local_b8[1] = pdVar2[1];
          local_e8[0] = 0.0;
          local_e8[1] = 0.0;
          local_e8[2] = 0.0;
          lVar9 = 0;
          do {
            local_e8[lVar9] = local_b8[lVar9] - local_68.super_Vector<double,_3U>.data_[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          local_128 = 0.0;
          p_Stack_120 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_118 = 0;
          lVar9 = 0;
          do {
            (&local_128)[lVar9] = local_e8[lVar9] * local_c8;
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          local_108 = 0.0;
          p_Stack_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_f8 = 0;
          lVar9 = 0;
          do {
            (&local_108)[lVar9] =
                 (&local_128)[lVar9] + local_68.super_Vector<double,_3U>.data_[lVar9];
            lVar9 = lVar9 + 1;
          } while (lVar9 != 3);
          local_88 = local_f8;
          local_98 = local_108;
          p_Stack_90 = p_Stack_100;
          pSVar5 = pSVar7->snapshotMan_->currentSnapshot_;
          lVar8 = (long)pSVar7->localIndex_;
          lVar9 = *(long *)((long)&(pSVar5->atomData).velocity.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + pSVar7->storage_);
          *(undefined8 *)(lVar9 + 0x10 + lVar8 * 0x18) = local_f8;
          pdVar2 = (double *)(lVar9 + lVar8 * 0x18);
          *pdVar2 = local_108;
          pdVar2[1] = (double)p_Stack_100;
          if (pSVar7->objType_ - otDAtom < 2) {
            lVar9 = *(long *)((long)&(pSVar5->atomData).angularMomentum.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + pSVar7->storage_);
            local_e8[2] = (double)*(undefined8 *)(lVar9 + 0x10 + lVar8 * 0x18);
            pdVar2 = (double *)(lVar9 + lVar8 * 0x18);
            local_e8[0] = *pdVar2;
            local_e8[1] = pdVar2[1];
            local_128 = 0.0;
            p_Stack_120 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_118 = 0;
            lVar9 = 0;
            do {
              (&local_128)[lVar9] = local_e8[lVar9] * local_c8;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            local_f8 = local_118;
            local_108 = local_128;
            p_Stack_100 = p_Stack_120;
            iVar3 = pSVar7->localIndex_;
            lVar9 = *(long *)((long)&(pSVar7->snapshotMan_->currentSnapshot_->atomData).
                                     angularMomentum.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + pSVar7->storage_);
            *(undefined8 *)(lVar9 + 0x10 + (long)iVar3 * 0x18) = local_118;
            pdVar2 = (double *)(lVar9 + (long)iVar3 * 0x18);
            *pdVar2 = local_128;
            pdVar2[1] = (double)p_Stack_120;
          }
          pSVar7 = SelectionManager::nextSelected(smanB,&local_10c);
        } while (pSVar7 != (StuntDouble *)0x0);
      }
      if ((this->super_RNEMD).useChargedSPF_ == true) {
        local_128 = 0.0;
        this_00 = this->forceManager_->selectedMolecule_;
        if (this_00 != (Molecule *)0x0) {
          local_128 = Molecule::getFixedCharge(this_00);
        }
        pSVar4 = (this->super_RNEMD).info_;
        Snapshot::getSPFData((this->super_RNEMD).currentSnap_);
        MPI_Bcast(&local_128,1,&ompi_mpi_double,
                  (pSVar4->molToProcMap_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[*(int *)((long)local_108 + 0x20)],
                  &ompi_mpi_comm_world);
        if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
        }
        dVar6 = this->spfTarget_ * local_128;
      }
      else {
        dVar6 = this->spfTarget_;
      }
      (this->super_RNEMD).particleExchange_ = dVar6 + (this->super_RNEMD).particleExchange_;
      (this->super_RNEMD).kineticExchange_ =
           (this->super_RNEMD).kineticTarget_ + (this->super_RNEMD).kineticExchange_;
    }
    else {
      puVar1 = &(this->super_RNEMD).failTrialCount_;
      *puVar1 = *puVar1 + 1;
    }
    pSVar5 = (this->super_RNEMD).currentSnap_;
    pSVar5->hasTranslationalKineticEnergy = false;
    pSVar5->hasRotationalKineticEnergy = false;
    pSVar5->hasKineticEnergy = false;
  }
  return;
}

Assistant:

void SPFMethod::doRNEMDImpl(SelectionManager& smanA,
                              SelectionManager& smanB) {
    if (!doRNEMD_) return;

    if (!forceManager_->getHasSelectedMolecule()) { selectMolecule(); }

    // Remove selected molecule from the source selection manager
    if (spfTarget_ > 0.0) {
      smanA -= selectedMoleculeMan_;
    } else {
      smanB -= selectedMoleculeMan_;
    }

    smanA_ = smanA;
    smanB_ = smanB;

    if (!failedLastTrial_) {
      Vector3d v_a {};
      Vector3d v_b {};
      RealType a {0.0};
      RealType b {0.0};

      isValidExchange(v_a, v_b, a, b);

      Vector3d vel;

      int selei {}, selej {};
      StuntDouble* sd;

      for (sd = smanA.beginSelected(selei); sd != NULL;
           sd = smanA.nextSelected(selei)) {
        vel = (sd->getVel() - v_a) * a + v_a;
        sd->setVel(vel);

        if (sd->isDirectional()) {
          Vector3d angMom = sd->getJ() * a;
          sd->setJ(angMom);
        }
      }

      for (sd = smanB.beginSelected(selej); sd != NULL;
           sd = smanB.nextSelected(selej)) {
        vel = (sd->getVel() - v_b) * b + v_b;
        sd->setVel(vel);

        if (sd->isDirectional()) {
          Vector3d angMom = sd->getJ() * b;
          sd->setJ(angMom);
        }
      }

      if (useChargedSPF_) {
        RealType fixedChargeOnIon {};

        if (Molecule* selectedMolecule = forceManager_->getSelectedMolecule();
            selectedMolecule) {
          fixedChargeOnIon = selectedMolecule->getFixedCharge();
        }

#ifdef IS_MPI
        MPI_Bcast(&fixedChargeOnIon, 1, MPI_REALTYPE,
                  info_->getMolToProc(currentSnap_->getSPFData()->globalID),
                  MPI_COMM_WORLD);
#endif

        particleExchange_ += spfTarget_ * fixedChargeOnIon;
      } else {
        particleExchange_ += spfTarget_;
      }

      kineticExchange_ += kineticTarget_;
    } else {
      failTrialCount_++;
    }

    currentSnap_->hasTranslationalKineticEnergy = false;
    currentSnap_->hasRotationalKineticEnergy    = false;
    currentSnap_->hasKineticEnergy              = false;
  }